

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

CopyResult cmSystemTools::CopySingleFile(string *oldname,string *newname,CopyWhen when,string *err)

{
  bool bVar1;
  Status SVar2;
  mode_t perm;
  Status local_58;
  mode_t local_4c;
  string local_48;
  
  if ((when == OnlyIfDifferent) &&
     (bVar1 = cmsys::SystemTools::FilesDiffer(oldname,newname), !bVar1)) {
    return Success;
  }
  local_4c = 0;
  SVar2 = cmsys::SystemTools::GetPermissions(oldname,&local_4c);
  bVar1 = cmsys::SystemTools::SameFile(oldname,newname);
  if (bVar1) {
    return Success;
  }
  local_58 = cmsys::SystemTools::CloneFileContent(oldname,newname);
  if ((local_58.Kind_ == Success) ||
     (local_58 = cmsys::SystemTools::CopyFileContentBlockwise(oldname,newname),
     local_58.Kind_ == Success)) {
    if (SVar2.Kind_ != Success) {
      return Success;
    }
    local_58 = cmsys::SystemTools::SetPermissions(newname,local_4c,false);
    if (local_58.Kind_ == Success) {
      return Success;
    }
  }
  if (err != (string *)0x0) {
    cmsys::Status::GetString_abi_cxx11_(&local_48,&local_58);
    std::__cxx11::string::operator=((string *)err,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return Failure;
}

Assistant:

cmSystemTools::CopyResult cmSystemTools::CopySingleFile(
  std::string const& oldname, std::string const& newname, CopyWhen when,
  std::string* err)
{
  switch (when) {
    case CopyWhen::Always:
      break;
    case CopyWhen::OnlyIfDifferent:
      if (!FilesDiffer(oldname, newname)) {
        return CopyResult::Success;
      }
      break;
  }

  mode_t perm = 0;
  cmsys::Status perms = SystemTools::GetPermissions(oldname, perm);

  // If files are the same do not copy
  if (SystemTools::SameFile(oldname, newname)) {
    return CopyResult::Success;
  }

  cmsys::Status status;
  status = cmsys::SystemTools::CloneFileContent(oldname, newname);
  if (!status) {
    // if cloning did not succeed, fall back to blockwise copy
    status = cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname);
  }
  if (!status) {
    if (err) {
      *err = status.GetString();
    }
    return CopyResult::Failure;
  }
  if (perms) {
    status = SystemTools::SetPermissions(newname, perm);
    if (!status) {
      if (err) {
        *err = status.GetString();
      }
      return CopyResult::Failure;
    }
  }
  return CopyResult::Success;
}